

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

void ToStringHelper(ON_COMPONENT_INDEX ci,char *buffer,size_t sizeof_buffer)

{
  char cVar1;
  TYPE TVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  char *str;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  char ubuffer [32];
  
  if (buffer == (char *)0x0) {
    return;
  }
  uVar4 = (ulong)ci >> 0x20;
  buffer[0x7f] = '\0';
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    buffer[lVar3] = "m_type="[lVar3];
  }
  lVar3 = 7;
  TVar2 = ci.m_type;
  switch(TVar2) {
  case invalid_type:
  case brep_trim|brep_edge:
  case brep_trim|brep_face:
  case 8:
  case 9:
  case 10:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    goto switchD_0056bc6f_caseD_43;
  case brep_vertex:
    pcVar5 = "ON_COMPONENT_INDEX::brep_vertex";
    break;
  case brep_edge:
    pcVar5 = "ON_COMPONENT_INDEX::brep_edge";
    break;
  case brep_face:
    pcVar5 = "ON_COMPONENT_INDEX::brep_face";
    break;
  case brep_trim:
    pcVar5 = "ON_COMPONENT_INDEX::brep_trim";
    break;
  case brep_loop:
    pcVar5 = "ON_COMPONENT_INDEX::brep_loop";
    break;
  case mesh_vertex:
    pcVar5 = "ON_COMPONENT_INDEX::mesh_vertex";
    break;
  case meshtop_vertex:
    pcVar5 = "ON_COMPONENT_INDEX::meshtop_vertex";
    break;
  case meshtop_edge:
    pcVar5 = "ON_COMPONENT_INDEX::meshtop_edge";
    break;
  case mesh_face:
    pcVar5 = "ON_COMPONENT_INDEX::mesh_face";
    break;
  case mesh_ngon:
    pcVar5 = "ON_COMPONENT_INDEX::mesh_ngon";
    break;
  case idef_part:
    pcVar5 = "ON_COMPONENT_INDEX::idef_part";
    break;
  case no_type:
    pcVar5 = "ON_COMPONENT_INDEX::no_type";
    break;
  default:
    switch(TVar2) {
    case extrusion_bottom_profile:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_bottom_profile";
      break;
    case extrusion_top_profile:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_top_profile";
      break;
    case extrusion_wall_edge:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_wall_edge";
      break;
    case extrusion_wall_surface:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_wall_surface";
      break;
    case extrusion_cap_surface:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_cap_surface";
      break;
    case extrusion_path:
      pcVar5 = "ON_COMPONENT_INDEX::extrusion_path";
      break;
    case extrusion_path|brep_vertex:
    case extrusion_wall_surface|brep_trim:
    case extrusion_wall_surface|brep_loop:
    case extrusion_wall_surface|brep_trim|brep_edge:
    case subd_edge|brep_edge:
    case subd_edge|brep_face:
    case subd_edge|brep_trim:
    case subd_edge|brep_loop:
    case subd_edge|brep_trim|brep_edge:
    case subd_edge|brep_trim|brep_face:
    case 0x50:
      goto switchD_0056bc6f_caseD_43;
    case subd_vertex:
      pcVar5 = "ON_COMPONENT_INDEX::subd_vertex";
      break;
    case subd_edge:
      pcVar5 = "ON_COMPONENT_INDEX::subd_edge";
      break;
    case subd_face:
      pcVar5 = "ON_COMPONENT_INDEX::subd_face";
      break;
    case hatch_loop:
      pcVar5 = "ON_COMPONENT_INDEX::hatch_loop";
      break;
    default:
      switch(TVar2) {
      case dim_linear_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_linear_point";
        break;
      case dim_radial_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_radial_point";
        break;
      case dim_angular_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_angular_point";
        break;
      case dim_ordinate_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_ordinate_point";
        break;
      case dim_text_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_text_point";
        break;
      case dim_centermark_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_centermark_point";
        break;
      case dim_leader_point:
        pcVar5 = "ON_COMPONENT_INDEX::dim_leader_point";
        break;
      default:
        if (TVar2 == polycurve_segment) {
          pcVar5 = "ON_COMPONENT_INDEX::polycurve_segment";
        }
        else if (TVar2 == pointcloud_point) {
          pcVar5 = "ON_COMPONENT_INDEX::pointcloud_point";
        }
        else {
          if (TVar2 != group_member) goto switchD_0056bc6f_caseD_43;
          pcVar5 = "ON_COMPONENT_INDEX::group_member";
        }
      }
    }
  }
  for (lVar6 = 7; (lVar3 = 0x7f, lVar6 != 0x7f && (lVar3 = lVar6, pcVar5[lVar6 + -7] != '\0'));
      lVar6 = lVar6 + 1) {
    buffer[lVar6] = pcVar5[lVar6 + -7];
  }
switchD_0056bc6f_caseD_43:
  for (lVar6 = 0; (uVar7 = lVar3 + lVar6, uVar7 != 0x7f && (lVar6 != 9)); lVar6 = lVar6 + 1) {
    buffer[lVar6 + lVar3] = " m_index="[lVar6];
  }
  if (ci.m_index < 1) {
    uVar4 = (ulong)(uint)-ci.m_index;
    for (lVar8 = 0; (uVar7 = lVar3 + lVar6 + lVar8, uVar7 < 0x7f && (lVar8 != 1)); lVar8 = lVar8 + 1
        ) {
      buffer[lVar6 + lVar8 + lVar3] = "-"[lVar8];
    }
  }
  pcVar5 = ubuffer + 0x1f;
  ubuffer[0x1f] = '\0';
  lVar3 = -0x1e;
  do {
    pcVar5[-1] = (byte)(uVar4 % 10) | 0x30;
    pcVar5 = pcVar5 + -1;
    if ((uint)uVar4 < 10) break;
    bVar9 = lVar3 != 0;
    uVar4 = uVar4 / 10;
    lVar3 = lVar3 + 1;
  } while (bVar9);
  do {
    if (0x7e < uVar7) {
      return;
    }
    cVar1 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    buffer[uVar7] = cVar1;
    uVar7 = uVar7 + 1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

static void ToStringHelper( ON_COMPONENT_INDEX ci, char* buffer, size_t sizeof_buffer )
{
  char* str = buffer;
  size_t str_capacity = sizeof_buffer/sizeof(buffer[0]);
  const char* s;
  const char* str_end;
  char ubuffer[32]; // unsigned int to string storage ubuffer
  unsigned int i, j;

  if ( nullptr == str || str_capacity <= 0 )
    return;

  str[--str_capacity] = 0;
  if (str_capacity <= 0)
    return;

  str_end = str + str_capacity;

  s = "m_type=";
  while ( str < str_end )
  {
    const char c = *s++;
    if (0 == c)
      break;

    *str++ = c;
  }

  switch(ci.m_type)
  {
  case ON_COMPONENT_INDEX::no_type:            s = "ON_COMPONENT_INDEX::no_type";            break;
  
  case ON_COMPONENT_INDEX::brep_vertex:        s = "ON_COMPONENT_INDEX::brep_vertex";        break;
  case ON_COMPONENT_INDEX::brep_edge:          s = "ON_COMPONENT_INDEX::brep_edge";          break;
  case ON_COMPONENT_INDEX::brep_face:          s = "ON_COMPONENT_INDEX::brep_face";          break;
  case ON_COMPONENT_INDEX::brep_trim:          s = "ON_COMPONENT_INDEX::brep_trim";          break;
  case ON_COMPONENT_INDEX::brep_loop:          s = "ON_COMPONENT_INDEX::brep_loop";          break;
  
  case ON_COMPONENT_INDEX::mesh_vertex:        s = "ON_COMPONENT_INDEX::mesh_vertex";        break;
  case ON_COMPONENT_INDEX::meshtop_vertex:     s = "ON_COMPONENT_INDEX::meshtop_vertex";     break;
  case ON_COMPONENT_INDEX::meshtop_edge:       s = "ON_COMPONENT_INDEX::meshtop_edge";       break;
  case ON_COMPONENT_INDEX::mesh_face:          s = "ON_COMPONENT_INDEX::mesh_face";          break;
  case ON_COMPONENT_INDEX::mesh_ngon:          s = "ON_COMPONENT_INDEX::mesh_ngon";          break;

  case ON_COMPONENT_INDEX::idef_part:          s = "ON_COMPONENT_INDEX::idef_part";          break;
  case ON_COMPONENT_INDEX::polycurve_segment:  s = "ON_COMPONENT_INDEX::polycurve_segment";  break;
  case ON_COMPONENT_INDEX::pointcloud_point:   s = "ON_COMPONENT_INDEX::pointcloud_point";   break;
  case ON_COMPONENT_INDEX::group_member:       s = "ON_COMPONENT_INDEX::group_member";       break;

  case ON_COMPONENT_INDEX::extrusion_bottom_profile: s = "ON_COMPONENT_INDEX::extrusion_bottom_profile"; break;
  case ON_COMPONENT_INDEX::extrusion_top_profile:    s = "ON_COMPONENT_INDEX::extrusion_top_profile";    break;
  case ON_COMPONENT_INDEX::extrusion_wall_edge:      s = "ON_COMPONENT_INDEX::extrusion_wall_edge";      break;
  case ON_COMPONENT_INDEX::extrusion_wall_surface:   s = "ON_COMPONENT_INDEX::extrusion_wall_surface";   break;
  case ON_COMPONENT_INDEX::extrusion_cap_surface:    s = "ON_COMPONENT_INDEX::extrusion_cap_surface";    break;
  case ON_COMPONENT_INDEX::extrusion_path:           s = "ON_COMPONENT_INDEX::extrusion_path";           break;

  case ON_COMPONENT_INDEX::subd_vertex:        s = "ON_COMPONENT_INDEX::subd_vertex";        break;
  case ON_COMPONENT_INDEX::subd_edge:          s = "ON_COMPONENT_INDEX::subd_edge";          break;
  case ON_COMPONENT_INDEX::subd_face:          s = "ON_COMPONENT_INDEX::subd_face";          break;

  case ON_COMPONENT_INDEX::hatch_loop:         s = "ON_COMPONENT_INDEX::hatch_loop";         break;

  case ON_COMPONENT_INDEX::dim_linear_point:   s = "ON_COMPONENT_INDEX::dim_linear_point";   break;
  case ON_COMPONENT_INDEX::dim_radial_point:   s = "ON_COMPONENT_INDEX::dim_radial_point";   break;
  case ON_COMPONENT_INDEX::dim_angular_point:  s = "ON_COMPONENT_INDEX::dim_angular_point";  break;
  case ON_COMPONENT_INDEX::dim_ordinate_point: s = "ON_COMPONENT_INDEX::dim_ordinate_point"; break;
  case ON_COMPONENT_INDEX::dim_text_point:     s = "ON_COMPONENT_INDEX::dim_text_point";     break;
  case ON_COMPONENT_INDEX::dim_centermark_point:     s = "ON_COMPONENT_INDEX::dim_centermark_point";     break;
  case ON_COMPONENT_INDEX::dim_leader_point:         s = "ON_COMPONENT_INDEX::dim_leader_point";         break;

  default: s = 0; break;
  }

  if ( 0 != s )
  {
    while ( str < str_end )
    {
      const char c = *s++;
      if (0 == c)
        break;

      *str++ = c;
    }
  }

  s = " m_index=";
  while ( str < str_end )
  {
    const char c = *s++;
    if (0 == c)
      break;

    *str++ = c;
  }

  if ( ci.m_index < 1 )
  {
    i = (unsigned int)(-ci.m_index);
    s = "-";
    while ( str < str_end )
    {
      const char c = *s++;
      if (0 == c)
        break;

      *str++ = c;
    }
  }
  else
  {
    i = (unsigned int)(ci.m_index);
  }
  
  j = sizeof(ubuffer)/sizeof(ubuffer[0]);
  j--;
  ubuffer[j] = 0;
  while(j > 0)
  {
    j--;
    ubuffer[j] = (char)('0'+i%10);
    i /= 10;
    if ( 0 == i )
      break;
  }

  s = &ubuffer[j];
  while ( str < str_end )
  {
    if ( 0 == (*str++ = *s++))
      break;
  }
}